

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# readdata.cpp
# Opt level: O2

int __thiscall ReadData::ReadRefPos(ReadData *this,BUFF *socketdata,uchar *HeadBuff)

{
  int iVar1;
  int iVar2;
  double dVar3;
  bool bVar4;
  uchar *Message;
  int iVar5;
  int aiStack_48 [2];
  ReadData *pRStack_40;
  uchar *local_38;
  uchar *puVar6;
  
  if ((this->Head).MessageID == 0x2f) {
    iVar5 = (this->Head).MessageLength;
    iVar2 = (int)((long)iVar5 + 4U);
    iVar1 = -1;
    if (-5 < iVar5) {
      iVar1 = iVar2;
    }
    pRStack_40 = (ReadData *)0x107c2c;
    local_38 = HeadBuff;
    Message = (uchar *)operator_new__((long)iVar1);
    iVar1 = socketdata->pos;
    if (socketdata->len - iVar1 < iVar5) {
      socketdata->pos = iVar1 + -0x1c;
      iVar5 = 2;
    }
    else {
      pRStack_40 = (ReadData *)0x107c69;
      memcpy(Message,socketdata->buff + iVar1,(long)iVar5 + 4U);
      socketdata->pos = iVar1 + iVar2;
      pRStack_40 = (ReadData *)0x107c86;
      puVar6 = Message;
      bVar4 = CRCCheck(local_38,Message,iVar5,iVar5);
      iVar5 = (int)puVar6;
      if (bVar4) {
        dVar3 = *(double *)(Message + 0x10);
        (this->UserPsrPos).B = *(double *)(Message + 8);
        (this->UserPsrPos).L = dVar3;
        (this->UserPsrPos).H = *(double *)(Message + 0x18);
        pRStack_40 = (ReadData *)U2L;
        operator_delete__(Message);
        pRStack_40 = this;
        memcpy(aiStack_48,Message,(long)iVar5);
        return aiStack_48[0];
      }
      pRStack_40 = (ReadData *)0x107c92;
      operator_delete__(Message);
      iVar5 = 3;
    }
  }
  else {
    iVar5 = 6;
  }
  return iVar5;
}

Assistant:

int ReadData::ReadRefPos(BUFF &socketdata, unsigned char* HeadBuff) {
    if(Head.MessageID != 47)
        return CONFLICT_ID;
    
    char* buff = new char [Head.MessageLength + 4];
    if(socketdata.len - socketdata.pos < Head.MessageLength) {
        socketdata.pos -= 28;
        return FILE_OR_BUFF_END;
    }
    memcpy(buff, socketdata.buff + socketdata.pos, Head.MessageLength + 4);
    socketdata.pos += Head.MessageLength + 4;
    if(!CRCCheck(HeadBuff, (unsigned char*)buff, Head.MessageLength, Head.MessageLength)) {
        delete[] buff;
        return CRC_FAILED;
    }

    try {
        UserPsrPos.B = C2D(buff + 8, 8);
        UserPsrPos.L = C2D(buff + 16, 8);
        UserPsrPos.H = C2D(buff + 24, 8);
    } 
    catch(...) {
        cout << "error happened when reading GPS ehpe" << endl;
        return UNKNOWN_ERROR;
    }
    
    delete [] buff;  
}